

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

bool Js::DateImplementation::TryParseMilliseconds
               (char16 *str,size_t length,size_t startIndex,int *value,size_t *foundDigits)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c1,"(str)","str");
    if (!bVar2) goto LAB_00a18fab;
    *puVar4 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c2,"(length)","length");
    if (!bVar2) goto LAB_00a18fab;
    *puVar4 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c3,"(startIndex <= length)","startIndex <= length");
    if (!bVar2) {
LAB_00a18fab:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar8 = length - startIndex;
  if (uVar8 != 0) {
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if (str[startIndex + uVar5] != L'0') break;
      uVar5 = uVar5 + 1;
      uVar6 = uVar8;
    } while (uVar5 < uVar8);
    uVar5 = uVar8;
    if (uVar8 < uVar6) {
      uVar5 = uVar6;
    }
    iVar3 = 0;
    while ((uVar7 = uVar5, uVar6 < uVar8 &&
           (uVar7 = uVar6, (ushort)(str[startIndex + uVar6] + L'￐') < 10))) {
      if (uVar6 < 3) {
        iVar3 = (uint)(ushort)(str[startIndex + uVar6] + L'￐') + iVar3 * 10;
      }
      uVar6 = uVar6 + 1;
    }
    if (uVar7 != 0) {
      *foundDigits = uVar7;
      if (uVar7 == 2) {
        iVar3 = iVar3 * 10;
      }
      else if (uVar7 == 1) {
        iVar3 = iVar3 * 100;
      }
      *value = iVar3;
      if (uVar8 <= uVar6) {
        return true;
      }
      return (ushort)(str[uVar7 + startIndex] + L'ￆ') < 0xfff6;
    }
  }
  return false;
}

Assistant:

bool DateImplementation::TryParseMilliseconds(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        int &value,
        size_t &foundDigits)
    {
        const size_t minNumDigits = 1;

        Assert(str);
        Assert(length);
        Assert(startIndex <= length);

        size_t allDigits = length - startIndex;
        if(allDigits < minNumDigits)
            return false;

        size_t i = 0;

        // Skip leading zeroes
        while(str[startIndex + i] == _u('0') && ++i < allDigits);

        // Parse remaining digits
        int v = 0;
        for(; i < allDigits ; ++i)
        {
            const unsigned short d = str[startIndex + i] - _u('0');
            if(d > 9)
                break;
            if (i < 3) // not past the 3rd digit in the milliseconds, don't ignore
                v = v * 10 + d;
        }
        if(i < minNumDigits)
            return false;

        foundDigits = i;
        if (foundDigits == 1)
                v = v * 100;
        else if (foundDigits == 2)
                v = v * 10;

        value = v;

        // The next character must not be a digit
        return !(i < length - startIndex && static_cast<unsigned short>(str[startIndex + i] - _u('0')) <= 9);
    }